

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

int send_streams_blocked(quicly_conn_t *conn,int uni,quicly_send_context_t *s)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  ulong uVar5;
  _func_void_void_ptr_char_ptr_varargs *p_Var6;
  int iVar7;
  uint64_t *puVar8;
  long lVar9;
  byte *pbVar10;
  long lVar11;
  quicly_sent_t *sent;
  quicly_sent_t *local_40;
  byte *local_38;
  
  puVar8 = (conn->egress).retire_cid.sequences + (ulong)(uni == 0) * 2 + -7;
  iVar7 = 0;
  if ((uint64_t *)*puVar8 != puVar8) {
    lVar11 = 0x6a0;
    if (uni == 0) {
      lVar11 = 0x6c8;
    }
    lVar2 = *(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x30);
    lVar3 = *(long *)((conn->egress).retire_cid.sequences[(ulong)(uni == 0) * 2 + -6] - 0xf8);
    lVar9 = lVar3 + 3;
    if (-1 < lVar3) {
      lVar9 = lVar3;
    }
    if (lVar2 != lVar9 >> 2) {
      __assert_fail("max_streams->count == oldest_blocked_stream->stream_id / 4",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xe63,"int send_streams_blocked(quicly_conn_t *, int, quicly_send_context_t *)"
                   );
    }
    if (*(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x28) < lVar2) {
      iVar7 = allocate_ack_eliciting_frame(conn,s,9,&local_40,on_ack_streams_blocked);
      if (iVar7 == 0) {
        pbVar4 = s->dst;
        uVar5 = *(ulong *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x30);
        *pbVar4 = uni == 0 ^ 0x17;
        pbVar10 = pbVar4 + 1;
        if (0x3f < uVar5) {
          if (uVar5 < 0x4000) {
            pbVar4[1] = (byte)(uVar5 >> 8) | 0x40;
            pbVar10 = pbVar4 + 2;
          }
          else {
            send_streams_blocked_cold_1();
            pbVar10 = local_38;
          }
        }
        *pbVar10 = (byte)uVar5;
        s->dst = pbVar10 + 1;
        (local_40->data).max_streams.uni = uni;
        lVar2 = *(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x30);
        if (lVar2 < *(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x28)) {
          __assert_fail("value >= m->max_committed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/maxsender.h"
                        ,0x69,
                        "void quicly_maxsender_record(quicly_maxsender_t *, int64_t, quicly_maxsender_sent_t *)"
                       );
        }
        *(long *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x28) = lVar2;
        puVar1 = (conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x18;
        *(long *)puVar1 = *(long *)puVar1 + 1;
        puVar1 = (conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x10;
        *puVar1 = *puVar1 & 0xfe;
        (local_40->data).packet.sent_at = lVar2 * 2 + 1;
        puVar8 = &(conn->super).stats.num_frames_sent.streams_blocked;
        *puVar8 = *puVar8 + 1;
        p_Var6 = (conn->super).tracer.cb;
        if (p_Var6 == (_func_void_void_ptr_char_ptr_varargs *)0x0) {
          iVar7 = 0;
        }
        else {
          iVar7 = 0;
          (*p_Var6)((conn->super).tracer.ctx,
                    "{\"type\":\"streams-blocked-send\", \"time\":%lld, \"maximum\":%llu, \"is-unidirectional\":%lld}\n"
                    ,(conn->stash).now,
                    *(undefined8 *)((conn->super).local.cid_set.cids[0].cid.cid + lVar11 + -0x30),
                    uni);
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int send_streams_blocked(quicly_conn_t *conn, int uni, quicly_send_context_t *s)
{
    quicly_linklist_t *blocked_list = uni ? &conn->egress.pending_streams.blocked.uni : &conn->egress.pending_streams.blocked.bidi;
    int ret;

    if (!quicly_linklist_is_linked(blocked_list))
        return 0;

    struct st_quicly_max_streams_t *max_streams = uni ? &conn->egress.max_streams.uni : &conn->egress.max_streams.bidi;
    quicly_stream_t *oldest_blocked_stream =
        (void *)((char *)blocked_list->next - offsetof(quicly_stream_t, _send_aux.pending_link.control));
    assert(max_streams->count == oldest_blocked_stream->stream_id / 4);

    if (!quicly_maxsender_should_send_blocked(&max_streams->blocked_sender, max_streams->count))
        return 0;

    quicly_sent_t *sent;
    if ((ret = allocate_ack_eliciting_frame(conn, s, QUICLY_STREAMS_BLOCKED_FRAME_CAPACITY, &sent, on_ack_streams_blocked)) != 0)
        return ret;
    s->dst = quicly_encode_streams_blocked_frame(s->dst, uni, max_streams->count);
    sent->data.streams_blocked.uni = uni;
    quicly_maxsender_record(&max_streams->blocked_sender, max_streams->count, &sent->data.streams_blocked.args);

    ++conn->super.stats.num_frames_sent.streams_blocked;
    QUICLY_PROBE(STREAMS_BLOCKED_SEND, conn, conn->stash.now, max_streams->count, uni);

    return 0;
}